

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O0

void OpenSteer::OpenSteerDemo::initialize(void)

{
  PlugIn *in_RAX;
  ostream *poVar1;
  ostream *unaff_retaddr;
  
  selectDefaultPlugIn();
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Known plugins:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PlugIn::applyToAll((plugInCallBackFunction)unaff_retaddr);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  if (selectedPlugIn == (PlugIn *)0x0) {
    errorExit((char *)0x114c3c);
  }
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Default plugin:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout," ");
  poVar1 = operator<<(unaff_retaddr,in_RAX);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  openSelectedPlugIn();
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::initialize (void)
{
    // select the default PlugIn
    selectDefaultPlugIn ();

    {
        // XXX this block is for debugging purposes,
        // XXX should it be replaced with something permanent?

        std::cout << std::endl << "Known plugins:" << std::endl;   // xxx?
        PlugIn::applyToAll (printPlugIn);                          // xxx?
        std::cout << std::endl;                                    // xxx?

        // identify default PlugIn
        if (!selectedPlugIn) errorExit ("no default PlugIn");
        std::cout << std::endl << "Default plugin:" << std::endl;  // xxx?
        std::cout << " " << *selectedPlugIn << std::endl;          // xxx?
        std::cout << std::endl;                                    // xxx?
    }

    // initialize the default PlugIn
    openSelectedPlugIn ();
}